

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-test.c++
# Opt level: O2

void __thiscall kj::anon_unknown_0::TestCase1958::run(TestCase1958 *this)

{
  SourceLocation location;
  PromiseBase this_00;
  PromiseForResult<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_test_c__:1973:20),_void>
  p2;
  Promise<void> p;
  DebugComparison<int,_int> _kjCondition;
  WaitScope waitScope;
  EventLoop loop;
  NullableValue<kj::Exception> local_1c8;
  char local_28;
  int local_18;
  
  EventLoop::EventLoop(&loop);
  waitScope.busyPollInterval = 0xffffffff;
  waitScope.fiber.ptr = (FiberBase *)0x0;
  waitScope.runningStacksPool.ptr = (FiberPool *)0x0;
  waitScope.loop = &loop;
  EventLoop::enterScope(&loop);
  kj::_::ReadyNow::operator_cast_to_Promise((ReadyNow *)&p);
  this_00.node.ptr = (OwnPromiseNode)operator_new(0x40);
  kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
            ((TransformPromiseNodeBase *)this_00.node.ptr,(OwnPromiseNode *)&p,
             kj::_::
             SimpleTransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++:1973:20)>
             ::anon_class_32_2_74578e90_for_func::operator());
  *(undefined ***)this_00.node.ptr = &PTR_destroy_0057bab0;
  *(undefined4 *)
   &(((TransformPromiseNodeBase *)((long)this_00.node.ptr + 0x20))->super_PromiseNode).
    super_PromiseArenaMember._vptr_PromiseArenaMember = 0x7b;
  *(undefined4 *)&((OwnPromiseNode *)((long)this_00.node.ptr + 0x30))->ptr = 0x1c8;
  local_1c8._0_8_ = 0;
  _kjCondition.left = 0;
  _kjCondition.right = 0;
  p2.super_PromiseBase.node.ptr = (PromiseBase)(PromiseBase)this_00.node.ptr;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
            ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&_kjCondition);
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
            ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&local_1c8);
  local_1c8._0_8_ = local_1c8._0_8_ & 0xffffffffffffff00;
  local_28 = '\0';
  location.function = "run";
  location.fileName =
       "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
  ;
  location.lineNumber = 0x7b9;
  location.columnNumber = 0x28;
  kj::_::waitImpl((OwnPromiseNode *)&p2,(ExceptionOrValue *)&local_1c8,&waitScope,location);
  if (local_28 == '\x01') {
    if (local_1c8.isSet != false) {
      throwRecoverableException(&local_1c8.field_1.value,0);
    }
    kj::_::NullableValue<kj::Exception>::~NullableValue(&local_1c8);
    _kjCondition.right = 0x243;
    _kjCondition.left = local_18;
    _kjCondition.op.content.ptr = " == ";
    _kjCondition.op.content.size_ = 5;
    _kjCondition.result = local_18 == 0x243;
    if ((!_kjCondition.result) && (kj::_::Debug::minSeverity < 3)) {
      kj::_::Debug::log<char_const(&)[45],kj::_::DebugComparison<int,int>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
                 ,0x7b9,ERROR,"\"failed: expected \" \"p2.wait(waitScope).i == 579\", _kjCondition",
                 (char (*) [45])"failed: expected p2.wait(waitScope).i == 579",&_kjCondition);
    }
    Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
              ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&p2);
    Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
              ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&p);
    WaitScope::~WaitScope(&waitScope);
    EventLoop::~EventLoop(&loop);
    return;
  }
  if (local_1c8.isSet != false) {
    throwFatalException(&local_1c8.field_1.value,0);
  }
  kj::_::unreachable();
}

Assistant:

~WeirdAlign() {
      KJ_EXPECT(reinterpret_cast<uintptr_t>(this) % 16 == 0);
    }